

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::ArrayNames::Run(ArrayNames *this)

{
  CallLogWrapper *this_00;
  GLuint program;
  uint uVar1;
  allocator<char> local_61;
  char *local_60 [4];
  long error;
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x15])(local_60,this);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(&error,this);
  program = PIQBase::CreateProgram((PIQBase *)this,local_60[0],(char *)error,false);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)local_60);
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  PIQBase::LinkProgram((PIQBase *)this,program);
  error = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"a",&local_61);
  uVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"a");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_60,(ulong)uVar1,&error);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"a[0]",&local_61);
  uVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"a");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_60,(ulong)uVar1,&error);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"a[1]",&local_61);
  uVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"a[1]");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_60,(ulong)uVar1,&error);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"a[2]",&local_61);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_60,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"a[0 + 0]",&local_61);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_60,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"a[0+0]",&local_61);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_60,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"a[ 0]",&local_61);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_60,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"a[0 ]",&local_61);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_60,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"a[\n0]",&local_61);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_60,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"a[\t0]",&local_61);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_60,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"a[01]",&local_61);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_60,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"a[00]",&local_61);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_60,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)local_60);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return error;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a", glGetUniformLocation(program, "a"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[0]", glGetUniformLocation(program, "a"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[1]", glGetUniformLocation(program, "a[1]"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[2]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[0 + 0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[0+0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[ 0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[0 ]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[\n0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[\t0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[01]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a[00]", -1, error);

		glDeleteProgram(program);
		return error;
	}